

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

ATMPArgs *
anon_unknown.dwarf_2401980::MemPoolAccept::ATMPArgs::SingleInPackageAccept(ATMPArgs *package_args)

{
  long lVar1;
  long in_RSI;
  ATMPArgs *in_RDI;
  long in_FS_OFFSET;
  optional<CFeeRate> in_stack_00000020;
  bool in_stack_ffffffffffffff9c;
  bool in_stack_ffffffffffffff9d;
  bool in_stack_ffffffffffffff9e;
  bool in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa4;
  bool in_stack_ffffffffffffffaf;
  uint in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ATMPArgs(*(ATMPArgs **)(in_RSI + 0x30),*(CChainParams **)(in_RSI + 0x28),
           (ulong)in_stack_ffffffffffffffb4 << 0x20,in_stack_ffffffffffffffaf,
           (vector<COutPoint,_std::allocator<COutPoint>_> *)CONCAT44(in_stack_ffffffffffffffa4,1),
           in_stack_ffffffffffffff9f,in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9d,
           in_stack_ffffffffffffff9c,false,in_stack_00000020,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static ATMPArgs SingleInPackageAccept(const ATMPArgs& package_args) {
            return ATMPArgs{/* m_chainparams */ package_args.m_chainparams,
                            /* m_accept_time */ package_args.m_accept_time,
                            /* m_bypass_limits */ false,
                            /* m_coins_to_uncache */ package_args.m_coins_to_uncache,
                            /* m_test_accept */ package_args.m_test_accept,
                            /* m_allow_replacement */ true,
                            /* m_allow_sibling_eviction */ true,
                            /* m_package_submission */ true, // do not LimitMempoolSize in Finalize()
                            /* m_package_feerates */ false, // only 1 transaction
                            /* m_client_maxfeerate */ package_args.m_client_maxfeerate,
                            /* m_allow_carveouts */ false,
            };
        }